

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufstream.c
# Opt level: O3

err_t BufFlush(bufstream *p)

{
  stream *psVar1;
  long lVar2;
  
  psVar1 = p->Stream;
  if ((psVar1 != (stream *)0x0) && (p->WritePos != 0)) {
    lVar2 = (**(code **)((long)(psVar1->Base).VMT + 0x70))(psVar1,p->Buffer,p->WritePos,0);
    if (lVar2 != 0) {
      return lVar2;
    }
    p->WritePos = 0;
  }
  return 0;
}

Assistant:

static NOINLINE err_t BufFlush(bufstream* p)
{
    err_t Err = ERR_NONE;
    if (p->Stream && p->WritePos>0)
    {
        Err = Stream_Write(p->Stream,p->Buffer,p->WritePos,NULL);
        if (Err == ERR_NONE)
            p->WritePos = 0;
    }
    return Err;
}